

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQbf.c
# Opt level: O2

void Abc_NtkVectorPrintPars(Vec_Int_t *vPiValues,int nPars)

{
  uint uVar1;
  int i;
  
  if (nPars < 1) {
    nPars = 0;
  }
  for (i = 0; nPars != i; i = i + 1) {
    uVar1 = Vec_IntEntry(vPiValues,i);
    printf("%d",(ulong)uVar1);
  }
  return;
}

Assistant:

void Abc_NtkVectorPrintPars( Vec_Int_t * vPiValues, int nPars )
{
    int i;
    for ( i = 0; i < nPars; i++ )
        printf( "%d", Vec_IntEntry(vPiValues,i) );
}